

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image_test.cc
# Opt level: O3

void __thiscall AomImageTest_AomImgAllocNv12_Test::TestBody(AomImageTest_AomImgAllocNv12_Test *this)

{
  undefined8 *puVar1;
  SEARCH_METHODS *pSVar2;
  AssertionResult gtest_ar;
  aom_image_t img;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  AssertHelper local_c8;
  internal local_c0 [8];
  undefined8 *local_b8;
  aom_image_t local_b0;
  
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       aom_img_alloc(&local_b0,AOM_IMG_FMT_NV12,0x80,0x80,0x20);
  local_c8.data_ = (AssertHelperData *)&local_b0;
  testing::internal::CmpHelperEQ<aom_image*,aom_image*>
            (local_c0,"aom_img_alloc(&img, format, kWidth, kHeight, align)","&img",
             (aom_image **)&local_d0,(aom_image **)&local_c8);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_b8 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_b8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_image_test.cc"
               ,0x45,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((aom_image_t *)local_d0._M_head_impl != (aom_image_t *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  puVar1 = local_b8;
  if (local_b8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_b8 != local_b8 + 2) {
      operator_delete((undefined8 *)*local_b8);
    }
    operator_delete(puVar1);
  }
  testing::internal::CmpHelperEQ<int,int>
            (local_c0,"img.stride[1]","img.stride[0]",local_b0.stride + 1,local_b0.stride);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_b8 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_b8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_image_test.cc"
               ,0x46,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((aom_image_t *)local_d0._M_head_impl != (aom_image_t *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  puVar1 = local_b8;
  if (local_b8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_b8 != local_b8 + 2) {
      operator_delete((undefined8 *)*local_b8);
    }
    operator_delete(puVar1);
  }
  local_d0._M_head_impl = local_d0._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            (local_c0,"img.stride[2]","0",local_b0.stride + 2,(int *)&local_d0);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_b8 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_b8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_image_test.cc"
               ,0x47,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  puVar1 = local_b8;
  if (local_b8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_b8 != local_b8 + 2) {
      operator_delete((undefined8 *)*local_b8);
    }
    operator_delete(puVar1);
  }
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<unsigned_char*,decltype(nullptr)>
            (local_c0,"img.planes[2]","nullptr",local_b0.planes + 2,&local_d0._M_head_impl);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_b8 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_b8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_image_test.cc"
               ,0x48,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (local_b8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_b8 != local_b8 + 2) {
      operator_delete((undefined8 *)*local_b8);
    }
    operator_delete(local_b8);
  }
  aom_img_free(&local_b0);
  return;
}

Assistant:

TEST(AomImageTest, AomImgAllocNv12) {
  const int kWidth = 128;
  const int kHeight = 128;

  aom_image_t img;
  aom_img_fmt_t format = AOM_IMG_FMT_NV12;
  unsigned int align = 32;
  EXPECT_EQ(aom_img_alloc(&img, format, kWidth, kHeight, align), &img);
  EXPECT_EQ(img.stride[AOM_PLANE_U], img.stride[AOM_PLANE_Y]);
  EXPECT_EQ(img.stride[AOM_PLANE_V], 0);
  EXPECT_EQ(img.planes[AOM_PLANE_V], nullptr);
  aom_img_free(&img);
}